

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::anon_unknown_0::MessageContainsExtensions
               (Descriptor *message)

{
  bool bVar1;
  int iVar2;
  Descriptor *message_00;
  int local_1c;
  int i;
  Descriptor *message_local;
  
  iVar2 = Descriptor::extension_count(message);
  if (iVar2 < 1) {
    for (local_1c = 0; iVar2 = Descriptor::nested_type_count(message), local_1c < iVar2;
        local_1c = local_1c + 1) {
      message_00 = Descriptor::nested_type(message,local_1c);
      bVar1 = MessageContainsExtensions(message_00);
      if (bVar1) {
        return true;
      }
    }
    message_local._7_1_ = false;
  }
  else {
    message_local._7_1_ = true;
  }
  return message_local._7_1_;
}

Assistant:

bool MessageContainsExtensions(const Descriptor* message) {
  if (message->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); i++) {
    if (MessageContainsExtensions(message->nested_type(i))) {
      return true;
    }
  }
  return false;
}